

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_NumberIsInteger(JSContext *ctx,JSValue val)

{
  int iVar1;
  uint32_t tag;
  uint uVar2;
  uint uVar3;
  double dVar4;
  double d;
  double local_10;
  
  d = (double)val.u;
  uVar3 = 0;
  uVar2 = (uint)val.tag;
  if ((uVar2 == 7) || (uVar2 == 0)) {
    if (0xfffffff4 < uVar2) {
      *(int *)d = *(int *)d + 1;
    }
    if (uVar2 < 3) {
      d = (double)val.u._0_4_;
    }
    else if ((uVar2 != 7) && (iVar1 = __JS_ToFloat64Free(ctx,&d,val), iVar1 != 0)) {
      return -1;
    }
    if ((ulong)ABS(d) < 0x7ff0000000000000) {
      local_10 = d;
      dVar4 = floor(d);
      uVar3 = -(uint)(dVar4 == local_10) & 1;
    }
  }
  return uVar3;
}

Assistant:

static int JS_NumberIsInteger(JSContext *ctx, JSValueConst val)
{
    double d;
    if (!JS_IsNumber(val))
        return FALSE;
    if (unlikely(JS_ToFloat64(ctx, &d, val)))
        return -1;
    return isfinite(d) && floor(d) == d;
}